

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O1

void __thiscall
OpenMD::
AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
::AndParamConstraint
          (AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
           *this,GreaterThanConstraint<double> *cons1,LessThanOrEqualToConstraint<double> *cons2)

{
  pointer pcVar1;
  ostream *poVar2;
  stringstream iss;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  GreaterThanConstraint<double> *local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->
  super_ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
  ).description_._M_dataplus._M_p =
       (pointer)&(this->
                 super_ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
                 ).description_.field_2;
  (this->
  super_ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
  ).description_._M_string_length = 0;
  (this->
  super_ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
  ).description_.field_2._M_local_buf[0] = '\0';
  (this->cons1_).super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.description_.
  _M_dataplus._M_p =
       (pointer)&(this->cons1_).super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.
                 description_.field_2;
  pcVar1 = (cons1->super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>).description_
           ._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->cons1_,pcVar1,
             pcVar1 + (cons1->super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>).
                      description_._M_string_length);
  (this->cons1_).rhs_ = cons1->rhs_;
  (this->cons2_).super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>.
  description_._M_dataplus._M_p =
       (pointer)&(this->cons2_).
                 super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>.
                 description_.field_2;
  pcVar1 = (cons2->super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>).
           description_._M_dataplus._M_p;
  local_1e0 = &this->cons1_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->cons2_,pcVar1,
             pcVar1 + (cons2->
                      super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>).
                      description_._M_string_length);
  (this->cons2_).rhs_ = cons2->rhs_;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(",1);
  pcVar1 = (this->cons1_).super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.
           description_._M_dataplus._M_p;
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar1,
             pcVar1 + (this->cons1_).
                      super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.
                      description_._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,local_1f8)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," and ",5);
  pcVar1 = (this->cons2_).super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>.
           description_._M_dataplus._M_p;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar1,
             pcVar1 + (this->cons2_).
                      super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>.
                      description_._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,(string *)&local_200);
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

AndParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << "(" << cons1_.getConstraintDescription() << " and "
          << cons2_.getConstraintDescription() << ")";
      this->description_ = iss.str();
    }